

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall KeyData_FromStringExtPrivkey_Test::TestBody(KeyData_FromStringExtPrivkey_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  AssertionResult gtest_ar;
  CfdException *e;
  undefined1 local_208 [8];
  KeyData obj1;
  anon_class_1_0_00000001 check_func;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  allocator local_31;
  undefined1 local_30 [8];
  string key1;
  KeyData_FromStringExtPrivkey_Test *this_local;
  
  key1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "[3456789a/1h/2/3h]xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  obj1.fingerprint_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0x80000001;
  this_00 = (allocator<unsigned_int> *)
            ((long)&obj1.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&obj1.fingerprint_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  cfd::core::KeyData::KeyData((KeyData *)local_208);
  cfd::core::KeyData::KeyData((KeyData *)&e,(string *)local_30,-1,false);
  cfd::core::KeyData::operator=((KeyData *)local_208,(KeyData *)&e);
  cfd::core::KeyData::~KeyData((KeyData *)&e);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2),(KeyData *)local_208,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  cfd::core::KeyData::~KeyData((KeyData *)local_208);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(KeyData, FromStringExtPrivkey) {
  std::string key1 = "[3456789a/1h/2/3h]xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_TRUE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_TRUE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV",
        obj.GetExtPrivkey().ToString().c_str());
    EXPECT_STREQ(
        "038746b92b722894e533dbbda3fb7fa673da00f4b309bf98a2cf586c27100004b0",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3']038746b92b722894e533dbbda3fb7fa673da00f4b309bf98a2cf586c27100004b0",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h]xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }
}